

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void cs_base64_emit_chunk(cs_base64_ctx *ctx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int c;
  int b;
  int a;
  cs_base64_ctx *ctx_local;
  
  bVar1 = ctx->chunk[0];
  bVar2 = ctx->chunk[1];
  bVar3 = ctx->chunk[2];
  cs_base64_emit_code(ctx,(int)(uint)bVar1 >> 2);
  cs_base64_emit_code(ctx,(bVar1 & 3) << 4 | (int)(uint)bVar2 >> 4);
  if (1 < ctx->chunk_size) {
    cs_base64_emit_code(ctx,(bVar2 & 0xf) << 2 | (int)(uint)bVar3 >> 6);
  }
  if (2 < ctx->chunk_size) {
    cs_base64_emit_code(ctx,bVar3 & 0x3f);
  }
  return;
}

Assistant:

static void cs_base64_emit_chunk(struct cs_base64_ctx *ctx) {
    int a, b, c;

    a = ctx->chunk[0];
    b = ctx->chunk[1];
    c = ctx->chunk[2];

    cs_base64_emit_code(ctx, a >> 2);
    cs_base64_emit_code(ctx, ((a & 3) << 4) | (b >> 4));
    if (ctx->chunk_size > 1) {
        cs_base64_emit_code(ctx, (b & 15) << 2 | (c >> 6));
    }
    if (ctx->chunk_size > 2) {
        cs_base64_emit_code(ctx, c & 63);
    }
}